

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObserverPtr.cpp
# Opt level: O0

void Rml::Detail::DeallocateObserverPtrBlockIfEmpty(ObserverPtrBlock *block)

{
  code *pcVar1;
  ObserverPtrData *pOVar2;
  bool bVar3;
  int iVar4;
  ObserverPtrBlock *block_local;
  
  if ((block->num_observers < 0) &&
     (bVar3 = Assert("RMLUI_ASSERT(block->num_observers >= 0)",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ObserverPtr.cpp"
                     ,0x2a), !bVar3)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  if ((((block->num_observers == 0) && (block->pointed_to_object == (void *)0x0)) &&
      (Pool<Rml::Detail::ObserverPtrBlock>::DestroyAndDeallocate
                 (&observer_ptr_data->block_pool,block), (observer_ptr_data->is_shutdown & 1U) != 0)
      ) && (iVar4 = Pool<Rml::Detail::ObserverPtrBlock>::GetNumAllocatedObjects
                              (&observer_ptr_data->block_pool), pOVar2 = observer_ptr_data,
           iVar4 == 0)) {
    if (observer_ptr_data != (ObserverPtrData *)0x0) {
      ObserverPtrData::~ObserverPtrData(observer_ptr_data);
      operator_delete(pOVar2,0x30);
    }
    observer_ptr_data = (ObserverPtrData *)0x0;
  }
  return;
}

Assistant:

void Detail::DeallocateObserverPtrBlockIfEmpty(ObserverPtrBlock* block)
{
	RMLUI_ASSERT(block->num_observers >= 0);
	if (block->num_observers == 0 && block->pointed_to_object == nullptr)
	{
		observer_ptr_data->block_pool.DestroyAndDeallocate(block);
		if (observer_ptr_data->is_shutdown && observer_ptr_data->block_pool.GetNumAllocatedObjects() == 0)
		{
			delete observer_ptr_data;
			observer_ptr_data = nullptr;
		}
	}
}